

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_10::ChElementTetraCorot_10(ChElementTetraCorot_10 *this,void **vtt)

{
  vector<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
  *this_00;
  ChLoadableUVW CVar1;
  _func_int **pp_Var2;
  DenseStorage<double,__1,__1,__1,_1> *this_01;
  pointer pMVar3;
  ActualDstType actualDst;
  ActualDstType actualDst_4;
  undefined1 auVar4 [64];
  assign_op<double,_double> local_59;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_58;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  *local_40;
  ChKblockGeneric *local_38;
  
  (this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron =
       (_func_int **)&PTR__ChElementTetrahedron_00b5c4a0;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_00b5b728;
  local_38 = &(this->super_ChElementGeneric).Kmatr;
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b62688;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational =
       (_func_int **)&PTR__ChElementCorotational_00b59778;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  *(undefined1 (*) [16])
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       ZEXT416(0) << 0x40;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = 1.0;
  *(undefined1 (*) [16])
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = ZEXT416(0) << 0x40;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = 0.0;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = 1.0;
  CVar1 = *(ChLoadableUVW *)(vtt + 1);
  this->super_ChLoadableUVW = CVar1;
  *(void **)((long)((long)(&this->super_ChElementCorotational + 1) + 8) +
            *(long *)((long)CVar1 + -0x78) + -8) = vtt[2];
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron = pp_Var2;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0xb5c5d8;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0xb5c698;
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 3);
  *(void **)(pp_Var2[-3] + -0x48 + (long)(&(this->super_ChElementCorotational).A + -1) + 0x40) =
       vtt[4];
  local_40 = &this->nodes;
  this_00 = &this->MatrB;
  this->Volume = 0.0;
  auVar4 = ZEXT464(0) << 0x40;
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                 )auVar4._0_24_;
  this->Material = (shared_ptr<chrono::fea::ChContinuumElastic>)auVar4._24_16_;
  this->MatrB = (vector<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                 )auVar4._40_24_;
  this->Material = (shared_ptr<chrono::fea::ChContinuumElastic>)auVar4._0_16_;
  this->MatrB = (vector<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                 )auVar4._16_24_;
  this->StiffnessMatrix = (ChMatrixDynamic<>)auVar4._40_24_;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(local_40,10);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>
  ::resize(this_00,4);
  this_01 = (DenseStorage<double,__1,__1,__1,_1> *)
            (this_00->
            super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(this_01,0xb4,6,0x1e);
  local_58.m_rows.m_value = this_01->m_rows;
  local_58.m_cols.m_value = this_01->m_cols;
  local_58.m_functor.m_other = 0.0;
  if (-1 < (local_58.m_cols.m_value | local_58.m_rows.m_value)) {
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)this_01,&local_58,&local_59);
    pMVar3 = (this_00->
             super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)(pMVar3 + 1),0xb4,6,0x1e);
    local_58.m_rows.m_value =
         pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
    ;
    local_58.m_cols.m_value =
         pMVar3[1].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
    ;
    local_58.m_functor.m_other = 0.0;
    if (-1 < (local_58.m_cols.m_value | local_58.m_rows.m_value)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                ((Matrix<double,__1,__1,_1,__1,__1> *)(pMVar3 + 1),&local_58,&local_59);
      pMVar3 = (this_00->
               super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                ((DenseStorage<double,__1,__1,__1,_1> *)(pMVar3 + 2),0xb4,6,0x1e);
      local_58.m_rows.m_value =
           pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
      local_58.m_cols.m_value =
           pMVar3[2].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_cols;
      local_58.m_functor.m_other = 0.0;
      if (-1 < (local_58.m_cols.m_value | local_58.m_rows.m_value)) {
        Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                  ((Matrix<double,__1,__1,_1,__1,__1> *)(pMVar3 + 2),&local_58,&local_59);
        pMVar3 = (this_00->
                 super__Vector_base<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                  ((DenseStorage<double,__1,__1,__1,_1> *)(pMVar3 + 3),0xb4,6,0x1e);
        local_58.m_rows.m_value =
             pMVar3[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_rows;
        local_58.m_cols.m_value =
             pMVar3[3].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_cols;
        local_58.m_functor.m_other = 0.0;
        if (-1 < (local_58.m_cols.m_value | local_58.m_rows.m_value)) {
          Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((Matrix<double,__1,__1,_1,__1,__1> *)(pMVar3 + 3),&local_58,&local_59);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                    ((DenseStorage<double,__1,__1,__1,_1> *)&this->StiffnessMatrix,900,0x1e,0x1e);
          local_58.m_rows.m_value =
               (this->StiffnessMatrix).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
          local_58.m_cols.m_value =
               (this->StiffnessMatrix).
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
          local_58.m_functor.m_other = 0.0;
          if (-1 < (local_58.m_cols.m_value | local_58.m_rows.m_value)) {
            Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                      (&this->StiffnessMatrix,&local_58,&local_59);
            return;
          }
        }
      }
    }
  }
  local_58.m_functor.m_other = 0.0;
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
               );
}

Assistant:

ChElementTetraCorot_10::ChElementTetraCorot_10() : Volume(0) {
    nodes.resize(10);
    MatrB.resize(4);  // standard: 4 integration points
    MatrB[0].setZero(6, 30);
    MatrB[1].setZero(6, 30);
    MatrB[2].setZero(6, 30);
    MatrB[3].setZero(6, 30);
    this->StiffnessMatrix.setZero(30, 30);
}